

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# primitive_dictionary.hpp
# Opt level: O0

void __thiscall
duckdb::PrimitiveDictionary<duckdb::string_t,_duckdb::string_t,_duckdb::ParquetCastOperator>::
PrimitiveDictionary(PrimitiveDictionary<duckdb::string_t,_duckdb::string_t,_duckdb::ParquetCastOperator>
                    *this,Allocator *allocator_p,idx_t maximum_size_p,
                   idx_t maximum_target_capacity_p)

{
  undefined8 uVar1;
  data_ptr_t pdVar2;
  idx_t iVar3;
  undefined8 in_RCX;
  undefined8 in_RDX;
  undefined8 in_RSI;
  undefined8 *in_RDI;
  idx_t i;
  idx_t in_stack_ffffffffffffffa0;
  Allocator *this_00;
  ulong local_38;
  
  *in_RDI = in_RSI;
  in_RDI[1] = in_RDX;
  in_RDI[2] = 0;
  uVar1 = duckdb::NextPowerOfTwo(in_RDI[1] * 2);
  in_RDI[3] = uVar1;
  in_RDI[4] = in_RDI[3] + -1;
  in_RDI[5] = in_RCX;
  this_00 = (Allocator *)(in_RDI + 6);
  Allocator::Allocate(this_00,in_stack_ffffffffffffffa0);
  MinValue<unsigned_long>(0x100000,in_RDI[5]);
  Allocator::Allocate(this_00,in_stack_ffffffffffffffa0);
  pdVar2 = AllocatedData::get((AllocatedData *)(in_RDI + 9));
  iVar3 = AllocatedData::GetSize((AllocatedData *)(in_RDI + 9));
  duckdb::MemoryStream::MemoryStream((MemoryStream *)(in_RDI + 0xc),pdVar2,iVar3);
  pdVar2 = AllocatedData::get((AllocatedData *)(in_RDI + 6));
  in_RDI[0x12] = pdVar2;
  *(undefined1 *)(in_RDI + 0x13) = 0;
  for (local_38 = 0; local_38 < (ulong)in_RDI[3]; local_38 = local_38 + 1) {
    *(undefined4 *)(in_RDI[0x12] + local_38 * 0x18 + 0x10) = 0xffffffff;
  }
  return;
}

Assistant:

PrimitiveDictionary(Allocator &allocator_p, idx_t maximum_size_p, idx_t maximum_target_capacity_p)
	    : allocator(allocator_p), maximum_size(maximum_size_p), size(0),
	      capacity(NextPowerOfTwo(maximum_size * LOAD_FACTOR)), capacity_mask(capacity - 1),
	      maximum_target_capacity(maximum_target_capacity_p),
	      allocated_dictionary(allocator.Allocate(capacity * sizeof(primitive_dictionary_entry_t))),
	      allocated_target(allocator.Allocate(std::is_same<TGT, string_t>::value
	                                              ? MinValue(INITIAL_TARGET_CAPACITY, maximum_target_capacity)
	                                              : capacity * sizeof(TGT))),
	      target_stream(allocated_target.get(), allocated_target.GetSize()),
	      dictionary(reinterpret_cast<primitive_dictionary_entry_t *>(allocated_dictionary.get())), full(false) {
		// Initialize empty
		for (idx_t i = 0; i < capacity; i++) {
			dictionary[i].index = INVALID_INDEX;
		}
	}